

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

bool __thiscall ON_OffsetSurface::SetBaseSurface(ON_OffsetSurface *this,ON_Surface *base_surface)

{
  ON_OffsetSurface *pOVar1;
  ON_Surface *pOVar2;
  
  if (this != (ON_OffsetSurface *)base_surface) {
    if (base_surface == (ON_Surface *)0x0) {
      pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
      if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
        (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[4])();
      }
      this->m__pSrf = (ON_Surface *)0x0;
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,(ON_Surface *)0x0);
      ON_OffsetSurfaceFunction::Destroy(&this->m_offset_function);
      (this->m_offset_function).m_srf = (ON_Surface *)0x0;
    }
    else {
      pOVar2 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
      if (pOVar2 != base_surface) {
        pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
        if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
          (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[4])();
        }
        this->m__pSrf = (ON_Surface *)0x0;
        ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,base_surface);
      }
    }
    pOVar2 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
    ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar2);
  }
  return this != (ON_OffsetSurface *)base_surface;
}

Assistant:

bool ON_OffsetSurface::SetBaseSurface(
  const ON_Surface* base_surface
  )
{
  bool rc = false;
  if ( this != base_surface )
  {
    rc = true;
    if ( 0 == base_surface )
    {
      if ( 0 != m__pSrf && this != m__pSrf )
        delete m__pSrf;
      m__pSrf = 0;
      ON_SurfaceProxy::SetProxySurface(0);
      m_offset_function.SetBaseSurface(0);
    }
    else if ( BaseSurface() != base_surface )
    {
      if ( 0 != m__pSrf && this != m__pSrf )
        delete m__pSrf;
      m__pSrf = 0;
      ON_SurfaceProxy::SetProxySurface(base_surface);
    }
    m_offset_function.SetBaseSurface( BaseSurface() );
  }
  return rc;
}